

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O1

void __thiscall tonk::BandwidthEstimator::OnInterval(BandwidthEstimator *this,uint intervalUsec)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  Counter32 CVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  (this->Measurement).TimestampUsec = (this->Previous).ReceiveUsec;
  if (intervalUsec == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (uint)(((ulong)this->IntervalDatagramBytes * 1000000) / (ulong)intervalUsec);
  }
  (this->Measurement).LatestProbeBPS = uVar8;
  iVar9 = (int)(this->Previous).Nonce - (int)(this->Start).Nonce;
  iVar10 = iVar9 - this->IntervalInSeqCount;
  auVar14._4_12_ = in_ZMM0._4_12_;
  auVar14._0_4_ = (uint)(0 < iVar9) * (uint)(0 < iVar10) * (int)((float)iVar10 / (float)iVar9);
  auVar14 = vfmadd132ss_fma(ZEXT416((uint)(this->Measurement).SmoothedPLR),auVar14,
                            ZEXT416(0x40e00000));
  (this->Measurement).SmoothedPLR = auVar14._0_4_ * 0.125;
  uVar2 = (this->Measurement).SmoothedGoodputBPS;
  uVar11 = uVar2 * 7 + uVar8 >> 3;
  if (uVar2 == 0) {
    uVar11 = uVar8;
  }
  (this->Measurement).SmoothedGoodputBPS = uVar11;
  auVar5._0_4_ = this->IntervalMaxTripUsec;
  auVar5._4_4_ = *(undefined4 *)&this->field_0x84;
  auVar5._8_8_ = this->NextExpectedNonce;
  uVar1._0_4_ = (this->Measurement).SmoothedMaxTripUsec;
  uVar1._4_4_ = (this->Measurement).SmoothedMinTripUsec;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  uVar6 = vptestmd_avx512vl(auVar12,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar1;
  auVar14 = vpslld_avx(auVar13,3);
  auVar14 = vpsubd_avx(auVar14,auVar13);
  auVar5 = vpinsrd_avx(auVar5,(this->Previous).NetworkTripUsec,1);
  auVar14 = vpaddd_avx(auVar14,auVar5);
  auVar14 = vpsrld_avx512vl(auVar14,3);
  bVar3 = (bool)((byte)(uVar6 & 0xf) & 1);
  bVar4 = (bool)((byte)((uVar6 & 0xf) >> 1) & 1);
  (this->Measurement).SmoothedMaxTripUsec =
       (uint)bVar3 * auVar14._0_4_ | (uint)!bVar3 * auVar5._0_4_;
  (this->Measurement).SmoothedMinTripUsec =
       (uint)bVar4 * auVar14._4_4_ | (uint)!bVar4 * auVar5._4_4_;
  (this->Measurement).MinReceiveSendDeltaTS24.Value = (this->Previous).ReceiveSendDeltaTS24.Value;
  uVar8 = (this->InterPacketGap).MaxUsec;
  if (uVar8 != 0) {
    (this->InterPacketGap).SmoothedMaxUsec = (this->InterPacketGap).SmoothedMaxUsec * 7 + uVar8 >> 3
    ;
    (this->InterPacketGap).MaxUsec = 0;
  }
  (this->Start).NetworkTripUsec = (this->Previous).NetworkTripUsec;
  (this->Start).Nonce = (this->Previous).Nonce;
  (this->Start).SendTS24.Value = (this->Previous).SendTS24.Value;
  uVar8 = (this->Previous).DatagramBytes;
  CVar7.Value = (this->Previous).ReceiveSendDeltaTS24.Value;
  (this->Start).ReceiveUsec = (this->Previous).ReceiveUsec;
  (this->Start).DatagramBytes = uVar8;
  (this->Start).ReceiveSendDeltaTS24 = (Counter32)CVar7.Value;
  this->IntervalDatagramBytes = 0;
  this->IntervalInSeqCount = 0;
  return;
}

Assistant:

void BandwidthEstimator::OnInterval(const unsigned intervalUsec)
{
    // Record timestamp for the burst
    Measurement.TimestampUsec = Previous.ReceiveUsec;

    {
        // Calculate receive BPS
        const uint64_t scaledBytes = (uint64_t)IntervalDatagramBytes * 1000000ULL;
        const unsigned receiveBPS = intervalUsec > 0 ? (unsigned)(scaledBytes / intervalUsec) : 0;
        Measurement.LatestProbeBPS = receiveBPS;
    }

    // Calculate send BPS
    //const Counter24 sendIntervalTS24 = Previous.SendTS24 - Start.SendTS24;
    //const unsigned sendIntervalUsec = sendIntervalTS24.ToUnsigned() << kTime23LostBits;
    //Measurement.LatestGoodputBPS = sendIntervalUsec > 0 ? (unsigned)(scaledBytes / sendIntervalUsec) : 0;

    // Calculate PLR
    const int expected = (int)(int64_t)(Previous.Nonce - Start.Nonce);
    const int lossCount = expected - (int)IntervalInSeqCount;
    TONK_DEBUG_ASSERT(lossCount >= 0);

    float plr = 0.f;
    if (expected > 0 && lossCount > 0) {
        plr = (unsigned)lossCount / (float)expected;
    }

    // Smooth the received PLR using EWMA
    Measurement.SmoothedPLR = (Measurement.SmoothedPLR * 7.f + plr) / 8.f;

    // Smooth the received BPS using EWMA
    if (Measurement.SmoothedGoodputBPS == 0) {
        Measurement.SmoothedGoodputBPS = Measurement.LatestProbeBPS;
    }
    else {
        Measurement.SmoothedGoodputBPS = (Measurement.SmoothedGoodputBPS * 7 + Measurement.LatestProbeBPS) / 8;
    }

    // Smooth the minimum trip time estimate
    const unsigned minTripUsec = Previous.NetworkTripUsec;
    if (Measurement.SmoothedMinTripUsec == 0) {
        Measurement.SmoothedMinTripUsec = minTripUsec;
    }
    else {
        Measurement.SmoothedMinTripUsec = (Measurement.SmoothedMinTripUsec * 7 + minTripUsec) / 8;
    }

    // Smooth the maximum trip time estimate
    const unsigned maxTripUsec = IntervalMaxTripUsec;
    if (Measurement.SmoothedMaxTripUsec == 0) {
        Measurement.SmoothedMaxTripUsec = maxTripUsec;
    }
    else {
        Measurement.SmoothedMaxTripUsec = (Measurement.SmoothedMaxTripUsec * 7 + maxTripUsec) / 8;
    }

    // Record the smallest ReceiveSendDeltaTS24
    Measurement.MinReceiveSendDeltaTS24 = Previous.ReceiveSendDeltaTS24;

    // Update statistics
    InterPacketGap.OnIntervalEnd();

    TONK_VERBOSE_BANDWIDTH_LOG(
        "ProbeBPS=", Measurement.LatestProbeBPS,
        " Goodput=", Measurement.SmoothedGoodputBPS,
        " MinTrip=", Previous.NetworkTripUsec,
        " Interval=", intervalUsec,
        " Bytes=", IntervalDatagramBytes,
        " Count=", IntervalInSeqCount,
        " PLR=", Measurement.SmoothedPLR,
        " AvgMin=", Measurement.SmoothedMinTripUsec,
        " AvgMax=", Measurement.SmoothedMaxTripUsec,
        " IPG=", InterPacketGap.Get());

    // Reset interval sampling
    Start = Previous;
    IntervalDatagramBytes = 0;
    IntervalInSeqCount = 0;
}